

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pTVar1;
  int iVar2;
  TString *key;
  TString *x_;
  TValue *io;
  TValue *io2;
  TValue *io1;
  TString *str;
  TValue *slot;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if ((t->tt_ & 0xf) == 5) {
    if (t->tt_ != 0x8005) {
      __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x280,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    if (((t->value_).gc)->tt != '\x05') {
      __assert_fail("(((t)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x280,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    str = (TString *)luaH_getstr((Table *)(t->value_).gc,key);
    if (*(LuaType *)&str->tt != 0) {
      pTVar1 = L->top;
      pTVar1->value_ = *(Value *)&str->next;
      pTVar1->tt_ = *(LuaType *)&str->tt;
      if ((pTVar1->tt_ & 0x8000) != 0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x281,"int auxgetstr(lua_State *, const TValue *, const char *)");
        }
        if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00117082:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x281,"int auxgetstr(lua_State *, const TValue *, const char *)");
        }
        if (L != (lua_State *)0x0) {
          if ((pTVar1->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x281,"int auxgetstr(lua_State *, const TValue *, const char *)");
          }
          if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_00117082;
        }
      }
      L->top = L->top + 1;
      if (L->ci->top < L->top) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x282,"int auxgetstr(lua_State *, const TValue *, const char *)");
      }
      goto LAB_001172ba;
    }
  }
  else {
    str = (TString *)0x0;
  }
  pTVar1 = L->top;
  if (9 < (key->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x285,"int auxgetstr(lua_State *, const TValue *, const char *)");
  }
  (pTVar1->value_).gc = (GCObject *)key;
  pTVar1->tt_ = key->tt | 0x8000;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x285,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00117223:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x285,"int auxgetstr(lua_State *, const TValue *, const char *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x285,"int auxgetstr(lua_State *, const TValue *, const char *)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00117223;
    }
  }
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x286,"int auxgetstr(lua_State *, const TValue *, const char *)");
  }
  luaV_finishget(L,t,L->top + -1,L->top + -1,(TValue *)str);
LAB_001172ba:
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return L->top[-1].tt_ & 0xf;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x289,"int auxgetstr(lua_State *, const TValue *, const char *)");
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    setobj2s(L, L->top, slot);
    api_incr_top(L);
  }
  else {
    setsvalue2s(L, L->top, str);
    api_incr_top(L);
    luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}